

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpicture.cpp
# Opt level: O0

int __thiscall QPicture::metric(QPicture *this,PaintDeviceMetric m)

{
  qreal qVar1;
  int iVar2;
  int in_ESI;
  long in_FS_OFFSET;
  int val;
  QRect brect;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  double dVar3;
  char *in_stack_ffffffffffffffa8;
  int iVar4;
  char local_38 [32];
  undefined1 local_18 [16];
  long local_8;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = (undefined1  [16])boundingRect((QPicture *)CONCAT44(in_ESI,0xaaaaaaaa));
  switch((QMessageLogger *)(ulong)(in_ESI - 1)) {
  case (QMessageLogger *)0x0:
    iVar4 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (QMessageLogger *)0x1:
    iVar4 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case (QMessageLogger *)0x2:
    iVar2 = qt_defaultDpiX();
    dVar3 = 25.4 / (double)iVar2;
    iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar4 = (int)(dVar3 * (double)iVar2);
    break;
  case (QMessageLogger *)0x3:
    iVar2 = qt_defaultDpiY();
    dVar3 = 25.4 / (double)iVar2;
    iVar2 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    iVar4 = (int)(dVar3 * (double)iVar2);
    break;
  case (QMessageLogger *)0x4:
    iVar4 = 0x1000000;
    break;
  case (QMessageLogger *)0x5:
    iVar4 = 0x18;
    break;
  case (QMessageLogger *)0x6:
  case (QMessageLogger *)0x8:
    iVar4 = qt_defaultDpiX();
    break;
  case (QMessageLogger *)0x7:
  case (QMessageLogger *)0x9:
    iVar4 = qt_defaultDpiY();
    break;
  case (QMessageLogger *)0xa:
    iVar4 = 1;
    break;
  case (QMessageLogger *)0xb:
    qVar1 = QPaintDevice::devicePixelRatioFScale();
    iVar4 = (int)(qVar1 * 1.0);
    break;
  default:
    iVar4 = 0;
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)(ulong)(in_ESI - 1),in_stack_ffffffffffffffa8,iVar2,
               (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    QMessageLogger::warning(local_38,"QPicture::metric: Invalid metric command");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

int QPicture::metric(PaintDeviceMetric m) const
{
    int val;
    QRect brect = boundingRect();
    switch (m) {
        case PdmWidth:
            val = brect.width();
            break;
        case PdmHeight:
            val = brect.height();
            break;
        case PdmWidthMM:
            val = int(25.4/qt_defaultDpiX()*brect.width());
            break;
        case PdmHeightMM:
            val = int(25.4/qt_defaultDpiY()*brect.height());
            break;
        case PdmDpiX:
        case PdmPhysicalDpiX:
            val = qt_defaultDpiX();
            break;
        case PdmDpiY:
        case PdmPhysicalDpiY:
            val = qt_defaultDpiY();
            break;
        case PdmNumColors:
            val = 16777216;
            break;
        case PdmDepth:
            val = 24;
            break;
        case PdmDevicePixelRatio:
            val = 1;
            break;
        case PdmDevicePixelRatioScaled:
            val = 1 * QPaintDevice::devicePixelRatioFScale();
            break;
        default:
            val = 0;
            qWarning("QPicture::metric: Invalid metric command");
    }
    return val;
}